

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

void isobufs_store_tx_data(isobusfs_buf_log *buffer,uint8_t *data)

{
  undefined8 *puVar1;
  undefined8 *in_RSI;
  long in_RDI;
  isobusfs_buf *entry;
  
  puVar1 = (undefined8 *)(in_RDI + (ulong)*(uint *)(in_RDI + 0xf0) * 0x18);
  *puVar1 = *in_RSI;
  clock_gettime(0,(timespec *)(puVar1 + 1));
  *(uint *)(in_RDI + 0xf0) = (*(int *)(in_RDI + 0xf0) + 1U) % 10;
  return;
}

Assistant:

void isobufs_store_tx_data(struct isobusfs_buf_log *buffer, uint8_t *data)
{
	struct isobusfs_buf *entry = &buffer->entries[buffer->index];

	/* we assume :) that data is at least 8 bytes long */
	memcpy(entry->data, data, sizeof(entry->data));
	clock_gettime(CLOCK_REALTIME, &entry->ts);

	buffer->index = (buffer->index + 1) % ISOBUSFS_MAX_BUF_ENTRIES;
}